

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> __thiscall
capnp::anon_unknown_34::BrokenClient::whenMoreResolved(BrokenClient *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX;
  long in_RSI;
  bool bVar1;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> MVar2;
  Exception local_1a0;
  
  bVar1 = *(char *)(in_RSI + 0x1b0) == '\0';
  if (bVar1) {
    kj::Exception::Exception(&local_1a0,(Exception *)(in_RSI + 0x20));
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              ((PromiseDisposer *)&(this->super_ClientHook).brand,&local_1a0);
    kj::Exception::~Exception(&local_1a0);
    in_RDX = extraout_RDX;
  }
  *(bool *)&(this->super_ClientHook)._vptr_ClientHook = bVar1;
  MVar2.ptr.field_1 = in_RDX;
  MVar2.ptr._0_8_ = this;
  return (Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>)MVar2.ptr;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    if (resolved) {
      return kj::none;
    } else {
      return kj::Promise<kj::Own<ClientHook>>(kj::cp(exception));
    }
  }